

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImPoolIdx IVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiTableTempData *pIVar9;
  ImGuiTable *pIVar10;
  float fVar11;
  float fVar12;
  ImGuiTable *in_stack_00000010;
  ImGuiTable *in_stack_00000030;
  float decoration_size_1;
  float decoration_size;
  ImVec2 backup_outer_max_pos;
  float new_width;
  float new_x2;
  ImGuiTableColumn *column_2;
  ImGuiTableColumn *column_1;
  float neighbor_width_to_keep_visible;
  ImGuiTableColumn *column;
  int column_n;
  float width_spacings;
  ImDrawListSplitter *splitter;
  float max_pos_x;
  float outer_padding_for_border;
  float inner_content_max_y;
  ImGuiTableTempData *temp_data;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTableFlags flags;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiTable *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff28;
  ImPoolIdx in_stack_ffffffffffffff2c;
  ImDrawList *in_stack_ffffffffffffff30;
  ImGuiTableColumn *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float lhs;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float local_90;
  float fStack_8c;
  ImDrawList *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar13;
  undefined4 in_stack_ffffffffffffffa4;
  ImVec2 local_4c;
  ImVec2 local_44;
  float local_3c;
  
  pIVar5 = GImGui;
  pIVar10 = GImGui->CurrentTable;
  if ((pIVar10->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout((ImGuiTable *)column_1);
  }
  uVar2 = pIVar10->Flags;
  window = pIVar10->InnerWindow;
  pIVar3 = pIVar10->OuterWindow;
  pIVar9 = pIVar10->TempData;
  if ((pIVar10->IsInsideRow & 1U) != 0) {
    TableEndRow(in_stack_00000010);
  }
  if (((((uVar2 & 0x20) != 0) && (pIVar10->HoveredColumnBody != -1)) &&
      (bVar6 = IsAnyItemHovered(), !bVar6)) && (bVar6 = IsMouseReleased(1), bVar6)) {
    TableOpenContextMenu(in_stack_ffffffffffffff44);
  }
  (window->DC).PrevLineSize = pIVar9->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar9->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar9->HostBackupCursorMaxPos;
  fVar12 = pIVar10->RowPosY2;
  if (window == pIVar3) {
    if ((uVar2 & 0x20000) == 0) {
      fVar11 = ImMax<float>((pIVar10->OuterRect).Max.y,fVar12);
      (pIVar10->InnerRect).Max.y = fVar11;
      (pIVar10->OuterRect).Max.y = fVar11;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar12;
  }
  fVar11 = ImMax<float>((pIVar10->WorkRect).Max.y,(pIVar10->OuterRect).Max.y);
  (pIVar10->WorkRect).Max.y = fVar11;
  fVar11 = ImRect::GetHeight(&pIVar10->OuterRect);
  pIVar10->LastOuterHeight = fVar11;
  if ((pIVar10->Flags & 0x1000000U) != 0) {
    in_stack_ffffffffffffff58 = 0;
    fVar11 = 1.0;
    if ((pIVar10->Flags & 0x400U) == 0) {
      fVar11 = 0.0;
    }
    lhs = (pIVar10->InnerWindow->DC).CursorMaxPos.x;
    in_stack_ffffffffffffff5c = fVar11;
    local_3c = lhs;
    if (pIVar10->RightMostEnabledColumn != -1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         (&pIVar10->Columns,(int)pIVar10->RightMostEnabledColumn);
      local_3c = ImMax<float>(lhs,(pIVar8->WorkMaxX + pIVar10->CellPaddingX + pIVar10->OuterPaddingX
                                  ) - fVar11);
      in_stack_ffffffffffffff54 = lhs;
    }
    if (pIVar10->ResizedColumn != -1) {
      local_3c = ImMax<float>(local_3c,pIVar10->ResizeLockMinContentsX2);
    }
    (pIVar10->InnerWindow->DC).CursorMaxPos.x = local_3c;
  }
  if ((uVar2 & 0x100000) == 0) {
    ImDrawList::PopClipRect(in_stack_ffffffffffffff30);
  }
  ImVector<ImVec4>::back(&window->DrawList->_ClipRectStack);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30,
                 (ImVec4 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  (window->ClipRect).Min = local_4c;
  (window->ClipRect).Max = local_44;
  if ((uVar2 & 0x780) != 0) {
    TableDrawBorders(in_stack_00000030);
  }
  ImDrawListSplitter::SetCurrentChannel
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (ImDrawList *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff44);
  if ((pIVar10->Flags & 0x100000U) == 0) {
    TableMergeDrawChannels(in_stack_00000100);
  }
  ImDrawListSplitter::Merge
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  pIVar10->ColumnsAutoFitWidth =
       pIVar10->CellPaddingX * 2.0 * (float)(int)pIVar10->ColumnsEnabledCount +
       pIVar10->OuterPaddingX + pIVar10->OuterPaddingX +
       (pIVar10->CellSpacingX1 + pIVar10->CellSpacingX2) *
       (float)(pIVar10->ColumnsEnabledCount + -1);
  for (iVar13 = 0; iVar13 < pIVar10->ColumnsCount; iVar13 = iVar13 + 1) {
    if ((pIVar10->EnabledMaskByIndex & 1L << ((byte)iVar13 & 0x3f)) != 0) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar10->Columns,iVar13);
      if (((pIVar8->Flags & 0x10U) == 0) || ((pIVar8->Flags & 0x20U) != 0)) {
        fVar11 = TableGetColumnWidthAuto
                           ((ImGuiTable *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38);
        pIVar10->ColumnsAutoFitWidth = fVar11 + pIVar10->ColumnsAutoFitWidth;
      }
      else {
        pIVar10->ColumnsAutoFitWidth = pIVar8->WidthRequest + pIVar10->ColumnsAutoFitWidth;
      }
    }
  }
  if (((pIVar10->Flags & 0x1000000U) == 0) && (window != pIVar3)) {
    (window->Scroll).x = 0.0;
  }
  else if ((pIVar10->LastResizedColumn != -1) &&
          (((pIVar10->ResizedColumn == -1 && ((window->ScrollbarX & 1U) != 0)) &&
           (pIVar10->InstanceInteracted == pIVar10->InstanceCurrent)))) {
    fVar11 = pIVar10->CellPaddingX + pIVar10->CellPaddingX + pIVar10->MinColumnWidth;
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar10->Columns,(int)pIVar10->LastResizedColumn)
    ;
    if ((pIVar10->InnerClipRect).Min.x <= pIVar8->MaxX) {
      pIVar1 = &(pIVar10->InnerClipRect).Max;
      if (pIVar1->x <= pIVar8->MaxX && pIVar8->MaxX != pIVar1->x) {
        SetScrollFromPosX(window,(pIVar8->MaxX - (window->Pos).x) + fVar11,1.0);
      }
    }
    else {
      SetScrollFromPosX(window,(pIVar8->MaxX - (window->Pos).x) - fVar11,1.0);
    }
  }
  if ((pIVar10->ResizedColumn != -1) && (pIVar10->InstanceCurrent == pIVar10->InstanceInteracted)) {
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar10->Columns,(int)pIVar10->ResizedColumn);
    fVar11 = ImFloor(-pIVar10->CellPaddingX + -pIVar10->CellPaddingX +
                     (((((pIVar5->IO).MousePos.x - (pIVar5->ActiveIdClickOffset).x) + 4.0) -
                      pIVar8->MinX) - pIVar10->CellSpacingX1));
    pIVar10->ResizedColumnNextWidth = fVar11;
  }
  PopID();
  IVar4 = (pIVar3->DC).CursorMaxPos;
  (window->WorkRect).Min = (pIVar9->HostBackupWorkRect).Min;
  (window->WorkRect).Max = (pIVar9->HostBackupWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar9->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = (pIVar9->HostBackupParentWorkRect).Max;
  window->SkipItems = (bool)(pIVar10->HostSkipItems & 1);
  (pIVar3->DC).CursorPos = (pIVar10->OuterRect).Min;
  (pIVar3->DC).ItemWidth = pIVar9->HostBackupItemWidth;
  (pIVar3->DC).ItemWidthStack.Size = pIVar9->HostBackupItemWidthStackSize;
  (pIVar3->DC).ColumnsOffset.x = (pIVar9->HostBackupColumnsOffset).x;
  if (window == pIVar3) {
    ImRect::GetSize((ImRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
    ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
            (ImGuiID)in_stack_ffffffffffffff54,
            (ImRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
            in_stack_ffffffffffffff44);
  }
  else {
    EndChild();
  }
  local_90 = IVar4.x;
  if ((pIVar10->Flags & 0x10000U) == 0) {
    if (0.0 < (pIVar9->UserOuterSize).x) {
      fVar11 = ImMax<float>(local_90,(pIVar10->OuterRect).Max.x);
      (pIVar3->DC).CursorMaxPos.x = fVar11;
    }
    else {
      if ((pIVar10->Flags & 0x1000000U) == 0) {
        in_stack_ffffffffffffff64 = 0.0;
      }
      else {
        in_stack_ffffffffffffff64 = (window->ScrollbarSizes).x;
      }
      fVar11 = ImMax<float>((pIVar3->DC).IdealMaxPos.x,
                            ((pIVar10->OuterRect).Min.x + pIVar10->ColumnsAutoFitWidth +
                            in_stack_ffffffffffffff64) - (pIVar9->UserOuterSize).x);
      (pIVar3->DC).IdealMaxPos.x = fVar11;
      fVar11 = ImMin<float>((pIVar10->OuterRect).Max.x,
                            (pIVar10->OuterRect).Min.x + pIVar10->ColumnsAutoFitWidth);
      fVar11 = ImMax<float>(local_90,fVar11);
      (pIVar3->DC).CursorMaxPos.x = fVar11;
    }
  }
  else {
    fVar11 = ImMax<float>(local_90,(pIVar10->OuterRect).Min.x + pIVar10->ColumnsAutoFitWidth);
    (pIVar3->DC).CursorMaxPos.x = fVar11;
  }
  fStack_8c = IVar4.y;
  if (0.0 < (pIVar9->UserOuterSize).y) {
    fVar12 = ImMax<float>(fStack_8c,(pIVar10->OuterRect).Max.y);
    (pIVar3->DC).CursorMaxPos.y = fVar12;
  }
  else {
    if ((pIVar10->Flags & 0x2000000U) == 0) {
      in_stack_ffffffffffffff60 = 0.0;
    }
    else {
      in_stack_ffffffffffffff60 = (window->ScrollbarSizes).y;
    }
    fVar11 = ImMax<float>((pIVar3->DC).IdealMaxPos.y,
                          (fVar12 + in_stack_ffffffffffffff60) - (pIVar9->UserOuterSize).y);
    (pIVar3->DC).IdealMaxPos.y = fVar11;
    fVar12 = ImMin<float>((pIVar10->OuterRect).Max.y,fVar12);
    fVar12 = ImMax<float>(fStack_8c,fVar12);
    (pIVar3->DC).CursorMaxPos.y = fVar12;
  }
  if ((pIVar10->IsSettingsDirty & 1U) != 0) {
    TableSaveSettings((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  pIVar10->IsInitializing = false;
  iVar13 = pIVar5->TablesTempDataStacked + -1;
  pIVar5->TablesTempDataStacked = iVar13;
  if (iVar13 < 1) {
    pIVar9 = (ImGuiTableTempData *)0x0;
  }
  else {
    pIVar9 = ImVector<ImGuiTableTempData>::operator[]
                       (&pIVar5->TablesTempData,pIVar5->TablesTempDataStacked + -1);
  }
  if (pIVar9 == (ImGuiTableTempData *)0x0) {
    pIVar10 = (ImGuiTable *)0x0;
  }
  else {
    pIVar10 = ImPool<ImGuiTable>::GetByIndex
                        ((ImPool<ImGuiTable> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  }
  pIVar5->CurrentTable = pIVar10;
  if (pIVar5->CurrentTable != (ImGuiTable *)0x0) {
    pIVar5->CurrentTable->TempData = pIVar9;
    pIVar5->CurrentTable->DrawSplitter = &pIVar9->DrawSplitter;
  }
  if (pIVar5->CurrentTable == (ImGuiTable *)0x0) {
    IVar7 = -1;
  }
  else {
    IVar7 = ImPool<ImGuiTable>::GetIndex(&pIVar5->Tables,pIVar5->CurrentTable);
  }
  (pIVar3->DC).CurrentTableIdx = IVar7;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}